

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O3

void __thiscall
particle_decay::perform_three_body_decay
          (particle_decay *this,particle_info *mother,particle_info *daughter1,
          particle_info *daughter2,particle_info *daughter3)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined4 uVar17;
  mapped_type *pmVar18;
  ostream *poVar19;
  long lVar20;
  particle_info *ppVar21;
  key_type *pkVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dStack_250;
  key_type local_a8 [30];
  
  dVar33 = mother->mass;
  ppVar21 = mother;
  pkVar22 = local_a8;
  for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
    uVar17 = *(undefined4 *)&ppVar21->field_0x4;
    pkVar22[0] = ppVar21->monval;
    pkVar22[1] = uVar17;
    ppVar21 = (particle_info *)&ppVar21->mass;
    pkVar22 = pkVar22 + 2;
  }
  pmVar18 = std::
            map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
            ::at(&this->resonance_table_,local_a8);
  dVar39 = daughter1->mass;
  dVar36 = daughter2->mass;
  dVar1 = daughter3->mass;
  if (dVar39 + dVar36 + dVar1 <= dVar33) {
    dVar25 = pmVar18->width;
    uVar6 = (ulong)DAT_0014f850;
    dVar32 = ((dVar33 - dVar39) - dVar36) - dVar1;
    do {
      do {
        peVar4 = (this->ran_gen_ptr_).
                 super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar35 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)(peVar4->ran_generator)._M_t.
                               super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               .
                               super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                           );
        peVar5 = (this->ran_gen_ptr_).
                 super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar23 = (peVar4->rand_uniform_dist)._M_param._M_a;
        dVar26 = (peVar4->rand_uniform_dist)._M_param._M_b;
        dVar9 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)(peVar5->ran_generator)._M_t.
                              super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                              .
                              super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                          );
        dVar2 = (peVar5->rand_uniform_dist)._M_param._M_a;
        dVar23 = (dVar35 * (dVar26 - dVar23) + dVar23) * dVar32 + dVar39;
        dVar26 = (dVar9 * ((peVar5->rand_uniform_dist)._M_param._M_b - dVar2) + dVar2) * dVar32 +
                 dVar36;
      } while (dVar33 < dVar23 + dVar26);
      dVar2 = dVar23 * dVar23 + (double)((ulong)dVar39 ^ uVar6) * dVar39;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar35 = dVar26 * dVar26 + (double)((ulong)dVar36 ^ uVar6) * dVar36;
      if (dVar35 < 0.0) {
        dVar35 = sqrt(dVar35);
      }
      else {
        dVar35 = SQRT(dVar35);
      }
      dVar26 = (dVar33 - dVar23) - dVar26;
      dVar23 = (((dVar26 * dVar26 - dVar2 * dVar2) - dVar35 * dVar35) +
               (double)((ulong)dVar1 ^ uVar6) * dVar1) / ((dVar2 + dVar2) * dVar35);
    } while (1.0 < ABS(dVar23));
    if (dVar25 <= 1e-10) {
      dVar33 = 10000000000.0;
    }
    else {
      dVar32 = mother->E;
      peVar4 = (this->ran_gen_ptr_).
               super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar9 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)(peVar4->ran_generator)._M_t.
                            super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                            .
                            super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                        );
      dVar26 = (peVar4->rand_uniform_dist)._M_param._M_a;
      dVar26 = log(dVar9 * ((peVar4->rand_uniform_dist)._M_param._M_b - dVar26) + dVar26);
      dVar33 = dVar26 * ((dVar32 / dVar33) / dVar25) * -0.19733;
    }
    dVar32 = mother->t + dVar33;
    dVar25 = mother->E;
    dVar26 = (mother->pz / dVar25) * dVar33 + mother->z;
    dVar28 = dVar35 * dVar23;
    dVar23 = 1.0 - dVar23 * dVar23;
    dVar29 = -(dVar2 + dVar28);
    dVar9 = mother->x;
    dVar16 = mother->y;
    auVar27._0_8_ = mother->px;
    auVar27._8_8_ = mother->py;
    auVar13._8_8_ = dVar25;
    auVar13._0_8_ = dVar25;
    auVar27 = divpd(auVar27,auVar13);
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      dVar23 = SQRT(dVar23);
    }
    dVar35 = dVar35 * dVar23;
    dVar23 = -dVar35;
    peVar4 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar34 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar4->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar25 = (peVar4->rand_uniform_dist)._M_param._M_a;
    dVar34 = (dVar34 * ((peVar4->rand_uniform_dist)._M_param._M_b - dVar25) + dVar25) *
             6.283185307179586;
    peVar4 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar10 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar4->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar25 = (peVar4->rand_uniform_dist)._M_param._M_a;
    dVar10 = (dVar10 * ((peVar4->rand_uniform_dist)._M_param._M_b - dVar25) + dVar25) *
             6.283185307179586;
    peVar4 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar11 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar4->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar25 = (peVar4->rand_uniform_dist)._M_param._M_a;
    dVar25 = ((peVar4->rand_uniform_dist)._M_param._M_b - dVar25) * dVar11 + dVar25;
    dVar40 = dVar25 + dVar25 + -1.0;
    dVar25 = sin(dVar34);
    dVar34 = cos(dVar34);
    dVar11 = sin(dVar10);
    dVar10 = cos(dVar10);
    dVar43 = 1.0 - dVar40 * dVar40;
    if (dVar43 < 0.0) {
      dVar43 = sqrt(dVar43);
    }
    else {
      dVar43 = SQRT(dVar43);
    }
    dVar9 = auVar27._0_8_ * dVar33 + dVar9;
    dVar16 = auVar27._8_8_ * dVar33 + dVar16;
    dVar37 = dVar2 * dVar40;
    dVar12 = dVar34 * dVar43 * dVar35 + dVar28 * dVar40;
    dVar41 = dVar34 * dVar23 * dVar43 + dVar29 * dVar40;
    dVar33 = mother->E;
    dVar42 = mother->pz / dVar33;
    dVar30 = -dVar2 * dVar43 * dVar10;
    dVar31 = dVar2 * dVar43 * dVar11;
    auVar3._0_8_ = mother->px;
    auVar3._8_8_ = mother->py;
    auVar7._8_4_ = SUB84(dVar33,0);
    auVar7._0_8_ = dVar33;
    auVar7._12_4_ = (int)((ulong)dVar33 >> 0x20);
    auVar27 = divpd(auVar3,auVar7);
    dVar45 = auVar27._8_8_;
    dVar44 = auVar27._0_8_;
    dVar38 = dVar42 * dVar42 + dVar44 * dVar44 + dVar45 * dVar45;
    dVar33 = 1.0 - dVar38;
    dVar39 = SQRT(dVar37 * dVar37 + dVar31 * dVar31 + dVar39 * dVar39 + dVar30 * dVar30);
    auVar15._8_4_ = SUB84(dVar16,0);
    auVar15._0_8_ = dVar9;
    auVar15._12_4_ = (int)((ulong)dVar16 >> 0x20);
    if (dVar33 < 0.0) {
      dVar33 = sqrt(dVar33);
    }
    else {
      dVar33 = SQRT(dVar33);
    }
    dVar33 = 1.0 / dVar33;
    dVar24 = dVar42 * dVar37 + dVar44 * dVar30 + dVar31 * dVar45;
    daughter1->E = (dVar39 + dVar24) * dVar33;
    dVar16 = dVar33 + -1.0;
    dVar39 = (dVar24 * dVar16) / dVar38 + dVar33 * dVar39;
    dVar30 = dVar39 * dVar44 + dVar30;
    dVar31 = dVar39 * dVar45 + dVar31;
    auVar14._8_4_ = SUB84(dVar31,0);
    auVar14._0_8_ = dVar30;
    auVar14._12_4_ = (int)((ulong)dVar31 >> 0x20);
    daughter1->px = dVar30;
    daughter1->py = (double)auVar14._8_8_;
    daughter1->pz = dVar39 * dVar42 + dVar37;
    dVar30 = dVar40 * dVar34 * dVar10 + -dVar25 * dVar11;
    dVar40 = dVar40 * -dVar34 * dVar11 + -dVar25 * dVar10;
    dVar34 = dVar35 * dVar30 + -(dVar28 * dVar43) * dVar10;
    dVar35 = dVar35 * dVar40 + dVar28 * dVar43 * dVar11;
    dVar25 = dVar42 * dVar12 + dVar44 * dVar34 + dVar35 * dVar45;
    daughter1->t = dVar32;
    dStack_250 = auVar15._8_8_;
    daughter1->x = dVar9;
    daughter1->y = dStack_250;
    daughter1->z = dVar26;
    dVar39 = SQRT(dVar12 * dVar12 + dVar35 * dVar35 + dVar36 * dVar36 + dVar34 * dVar34);
    daughter2->E = (dVar25 + dVar39) * dVar33;
    dVar39 = dVar39 * dVar33 + (dVar16 * dVar25) / dVar38;
    daughter2->px = dVar39 * dVar44 + dVar34;
    daughter2->py = dVar39 * dVar45 + dVar35;
    daughter2->pz = dVar39 * dVar42 + dVar12;
    dVar39 = dVar23 * dVar30 + dVar10 * (dVar2 + dVar28) * dVar43;
    dVar36 = dVar23 * dVar40 + dVar29 * dVar11 * dVar43;
    dVar25 = dVar42 * dVar41 + dVar44 * dVar39 + dVar36 * dVar45;
    daughter2->t = dVar32;
    daughter2->x = dVar9;
    daughter2->y = dStack_250;
    daughter2->z = dVar26;
    dVar1 = SQRT(dVar41 * dVar41 + dVar36 * dVar36 + dVar1 * dVar1 + dVar39 * dVar39);
    daughter3->E = (dVar25 + dVar1) * dVar33;
    dVar33 = dVar33 * dVar1 + (dVar16 * dVar25) / dVar38;
    dVar39 = dVar33 * dVar44 + dVar39;
    dVar36 = dVar33 * dVar45 + dVar36;
    auVar8._8_4_ = SUB84(dVar36,0);
    auVar8._0_8_ = dVar39;
    auVar8._12_4_ = (int)((ulong)dVar36 >> 0x20);
    daughter3->px = dVar39;
    daughter3->py = (double)auVar8._8_8_;
    daughter3->pz = dVar33 * dVar42 + dVar41;
    daughter3->t = dVar32;
    daughter3->x = dVar9;
    daughter3->y = dStack_250;
    daughter3->z = dVar26;
    return;
  }
  poVar19 = std::operator<<((ostream *)&std::cout,"Error:particleSamples::perform_three_body_decay:"
                           );
  poVar19 = std::operator<<(poVar19,"can not found decays!");
  std::endl<char,std::char_traits<char>>(poVar19);
  poVar19 = std::operator<<((ostream *)&std::cout,"M = ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar33);
  poVar19 = std::operator<<(poVar19,", m1 = ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar39);
  poVar19 = std::operator<<(poVar19,", m2 = ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar36);
  poVar19 = std::operator<<(poVar19,", m3 = ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,dVar1);
  std::endl<char,std::char_traits<char>>(poVar19);
  poVar19 = std::operator<<((ostream *)&std::cout,"reso: ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,mother->monval);
  poVar19 = std::operator<<(poVar19,", m1: ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,daughter1->monval);
  poVar19 = std::operator<<(poVar19,", m2: ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,daughter2->monval);
  poVar19 = std::operator<<(poVar19,", m3: ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,daughter3->monval);
  std::endl<char,std::char_traits<char>>(poVar19);
  exit(1);
}

Assistant:

void particle_decay::perform_three_body_decay(
    particle_info &mother, particle_info &daughter1, particle_info &daughter2,
    particle_info &daughter3) {
    double M_pole = mother.mass;
    double M_width = get_particle_width(mother);
    double m1 = daughter1.mass;
    double m2 = daughter2.mass;
    double m3 = daughter3.mass;
    double M_min = m1 + m2 + m3;
    if (M_pole < M_min) {
        cout << "Error:particleSamples::perform_three_body_decay:"
             << "can not found decays!" << endl;
        cout << "M = " << M_pole << ", m1 = " << m1 << ", m2 = " << m2
             << ", m3 = " << m3 << endl;
        cout << "reso: " << mother.monval << ", m1: " << daughter1.monval
             << ", m2: " << daughter2.monval << ", m3: " << daughter3.monval
             << endl;
        exit(1);
    }
    // double M_sampled = sample_breit_wigner(M_pole, M_width, M_min);
    double M_sampled = M_pole;
    // generate lrf E1, E2, and theta12 using accept and reject method
    double E1_lrf, E2_lrf, E3_lrf, p1_lrf, p2_lrf, cos12_lrf;
    do {
        do {
            E1_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m1;
            E2_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m2;
        } while (E1_lrf + E2_lrf > M_sampled);
        p1_lrf = sqrt(E1_lrf * E1_lrf - m1 * m1);
        p2_lrf = sqrt(E2_lrf * E2_lrf - m2 * m2);
        double E3_lrf = M_sampled - E1_lrf - E2_lrf;
        cos12_lrf =
            (E3_lrf * E3_lrf - p1_lrf * p1_lrf - p2_lrf * p2_lrf - m3 * m3)
            / (2. * p1_lrf * p2_lrf);
    } while (cos12_lrf < -1.0 || cos12_lrf > 1.0);
    // now we get the a good sample

    // sample the lifetime
    double life_time = 1e10;
    if (M_width > 1e-10) {
        double tau = mother.E / (M_sampled) * 1. / M_width;
        life_time = -tau * log(ran_gen_ptr_->rand_uniform());
        life_time *= AfterburnerUtil::hbarc;  // convert unit to fm
    }
    // compute the decay position
    double decay_time = mother.t + life_time;
    double decay_x = mother.x + mother.px / mother.E * life_time;
    double decay_y = mother.y + mother.py / mother.E * life_time;
    double decay_z = mother.z + mother.pz / mother.E * life_time;

    // compute the momentum of decay daughters
    double tp2_lrf_x = p2_lrf * sqrt(1. - cos12_lrf * cos12_lrf);
    double tp2_lrf_z = p2_lrf * cos12_lrf;
    double tp3_lrf_x = -tp2_lrf_x;
    double tp3_lrf_z = -(p1_lrf + tp2_lrf_z);
    double phi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double ksi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double cos_theta = 2. * ran_gen_ptr_->rand_uniform() - 1.0;

    double sin_phi = sin(phi);
    double cos_phi = cos(phi);
    double sin_ksi = sin(ksi);
    double cos_ksi = cos(ksi);
    double sin_theta = sqrt(1. - cos_theta * cos_theta);

    double p1_lrf_x = -p1_lrf * sin_theta * cos_ksi;
    double p1_lrf_y = p1_lrf * sin_theta * sin_ksi;
    double p1_lrf_z = p1_lrf * cos_theta;
    E1_lrf = sqrt(
        m1 * m1 + p1_lrf_x * p1_lrf_x + p1_lrf_y * p1_lrf_y
        + p1_lrf_z * p1_lrf_z);
    double p2_lrf_x =
        (tp2_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp2_lrf_z * sin_theta * cos_ksi);
    double p2_lrf_y =
        (tp2_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp2_lrf_z * sin_theta * sin_ksi);
    double p2_lrf_z = tp2_lrf_x * (cos_phi * sin_theta) + tp2_lrf_z * cos_theta;
    E2_lrf = sqrt(
        m2 * m2 + p2_lrf_x * p2_lrf_x + p2_lrf_y * p2_lrf_y
        + p2_lrf_z * p2_lrf_z);
    double p3_lrf_x =
        (tp3_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp3_lrf_z * sin_theta * cos_ksi);
    double p3_lrf_y =
        (tp3_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp3_lrf_z * (sin_theta * sin_ksi));
    double p3_lrf_z = tp3_lrf_x * cos_phi * sin_theta + tp3_lrf_z * cos_theta;
    E3_lrf = sqrt(
        m3 * m3 + p3_lrf_x * p3_lrf_x + p3_lrf_y * p3_lrf_y
        + p3_lrf_z * p3_lrf_z);

    double vx = mother.px / mother.E;
    double vy = mother.py / mother.E;
    double vz = mother.pz / mother.E;
    double v2 = vx * vx + vy * vy + vz * vz;
    double gamma = 1. / sqrt(1. - v2);
    double gamma_m_1 = gamma - 1.;
    double vp1 = vx * p1_lrf_x + vy * p1_lrf_y + vz * p1_lrf_z;
    double vp2 = vx * p2_lrf_x + vy * p2_lrf_y + vz * p2_lrf_z;
    double vp3 = vx * p3_lrf_x + vy * p3_lrf_y + vz * p3_lrf_z;

    daughter1.E = gamma * (E1_lrf + vp1);
    daughter1.px = p1_lrf_x + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vx;
    daughter1.py = p1_lrf_y + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vy;
    daughter1.pz = p1_lrf_z + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vz;
    daughter1.t = decay_time;
    daughter1.x = decay_x;
    daughter1.y = decay_y;
    daughter1.z = decay_z;

    daughter2.E = gamma * (E2_lrf + vp2);
    daughter2.px = p2_lrf_x + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vx;
    daughter2.py = p2_lrf_y + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vy;
    daughter2.pz = p2_lrf_z + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vz;
    daughter2.t = decay_time;
    daughter2.x = decay_x;
    daughter2.y = decay_y;
    daughter2.z = decay_z;

    daughter3.E = gamma * (E3_lrf + vp3);
    daughter3.px = p3_lrf_x + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vx;
    daughter3.py = p3_lrf_y + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vy;
    daughter3.pz = p3_lrf_z + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vz;
    daughter3.t = decay_time;
    daughter3.x = decay_x;
    daughter3.y = decay_y;
    daughter3.z = decay_z;
}